

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoNode.cc
# Opt level: O0

void __thiscall
VideoNode::VideoNode(VideoNode *this,path *project_root,string_view video_config_filename)

{
  PolledPipelineDesc *this_00;
  PolledFile *this_01;
  Resources *this_02;
  path local_148;
  path local_108;
  string local_c8;
  string_view local_a8;
  shared_ptr<PolledFile> local_98;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  path *local_28;
  path *project_root_local;
  VideoNode *this_local;
  string_view video_config_filename_local;
  
  video_config_filename_local._M_len = (size_t)video_config_filename._M_str;
  this_local = (VideoNode *)video_config_filename._M_len;
  local_28 = project_root;
  project_root_local = (path *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"VideoNode",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"video",&local_81);
  INode::INode(&this->super_INode,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__VideoNode_002b9610;
  this->mode_index = 1;
  (this->preview).w = 0x500;
  (this->preview).h = 0x2d0;
  this_00 = (PolledPipelineDesc *)operator_new(0x28);
  this_01 = (PolledFile *)operator_new(0x10);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (&local_148,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::experimental::filesystem::v1::__cxx11::operator/(&local_108,project_root,&local_148);
  std::experimental::filesystem::v1::__cxx11::path::string(&local_c8,&local_108);
  local_a8 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c8);
  PolledFile::PolledFile(this_01,local_a8);
  std::shared_ptr<PolledFile>::shared_ptr<PolledFile,void>(&local_98,this_01);
  PolledPipelineDesc::PolledPipelineDesc(this_00,&local_98);
  std::unique_ptr<PolledPipelineDesc,std::default_delete<PolledPipelineDesc>>::
  unique_ptr<std::default_delete<PolledPipelineDesc>,void>
            ((unique_ptr<PolledPipelineDesc,std::default_delete<PolledPipelineDesc>> *)
             &this->polled_pipeline,this_00);
  std::shared_ptr<PolledFile>::~shared_ptr(&local_98);
  std::__cxx11::string::~string((string *)&local_c8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_108);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_148);
  this_02 = (Resources *)operator_new(0xd8);
  Resources::Resources(this_02,project_root);
  std::unique_ptr<Resources,std::default_delete<Resources>>::
  unique_ptr<std::default_delete<Resources>,void>
            ((unique_ptr<Resources,std::default_delete<Resources>> *)&this->resources,this_02);
  std::unique_ptr<VideoEngine,std::default_delete<VideoEngine>>::
  unique_ptr<std::default_delete<VideoEngine>,void>
            ((unique_ptr<VideoEngine,std::default_delete<VideoEngine>> *)&this->engine);
  return;
}

Assistant:

VideoNode::VideoNode(fs::path project_root, std::string_view video_config_filename)
	: INode("VideoNode", "video")
	, preview{1280, 720}
	, polled_pipeline(new PolledPipelineDesc(
		std::shared_ptr<PolledFile>(
			new PolledFile(
				(project_root/video_config_filename).string()))))
	, resources(new Resources(project_root)) {
	GL_LOAD_FUNCS
}

VideoNode::~VideoNode() {}

void VideoNode::paint(float dt, const Timecode& tc, IScope &scope) {
	static unsigned int frame_seq = 0;
	frame_seq++;

	if (polled_pipeline->poll(frame_seq)) {
		engine.reset(new VideoEngine(*resources, polled_pipeline->get()));
		engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (engine)
		engine->paint(frame_seq, preview.w, preview.h, tc.row, dt, scope);
}

// void video_export(const ExportSettings &settings, const IAutomation &automation) {
// 	if (polled_pipeline && polled_pipeline->get()) {
// 		auto result = exportC(*resources, settings, *polled_pipeline->get().get(), automation);
// 		if (!result)
// 			MSG("Export error: %s", result.error().c_str());
// 	}
// }

void VideoNode::doUi() noexcept {
	if (ImGui::Combo("Resolution", &mode_index, c_mode_names, COUNTOF(c_mode_names))) {
		if (engine)
			engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (ImGui::Button("Make screensot") && engine) {
		// TODO filename picker
		// TODO incrementable filenames
		// TODO project-relative

		const char *filename = "screenshot.jpg";
		const Image screen = engine->makeScreenshot();
		const int result = stbi_write_jpg(filename, screen.w, screen.h, 3, screen.data.data(), 80);
		MSG("screenshot written to file %s, result: %d", filename, result);
	}
}

const renderdesc::Pipeline& VideoNode::getPipelineDesc() const {
	return *polled_pipeline->get().get();
}